

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  element_type *this;
  undefined1 local_20 [8];
  shared_ptr<SimpleCyclic::Cyclic> simpleCyclic;
  
  simpleCyclic.super___shared_ptr<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  SimpleCyclic::Cyclic::create();
  this = std::__shared_ptr_access<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_20);
  SimpleCyclic::Cyclic::doSomething(this);
  simpleCyclic.super___shared_ptr<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  std::shared_ptr<SimpleCyclic::Cyclic>::~shared_ptr((shared_ptr<SimpleCyclic::Cyclic> *)local_20);
  return simpleCyclic.super___shared_ptr<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
}

Assistant:

int main()
{
    auto simpleCyclic = SimpleCyclic::Cyclic::create();
    simpleCyclic->doSomething();

    return 0;
}